

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O2

void __thiscall
webrtc::AudioProcessingImpl::ApmPublicSubmodules::~ApmPublicSubmodules(ApmPublicSubmodules *this)

{
  std::
  unique_ptr<webrtc::IntelligibilityEnhancer,_std::default_delete<webrtc::IntelligibilityEnhancer>_>
  ::~unique_ptr(&this->intelligibility_enhancer);
  std::unique_ptr<webrtc::TransientSuppressor,_std::default_delete<webrtc::TransientSuppressor>_>::
  ~unique_ptr(&this->transient_suppressor);
  std::
  unique_ptr<webrtc::GainControlForExperimentalAgc,_std::default_delete<webrtc::GainControlForExperimentalAgc>_>
  ::~unique_ptr(&this->gain_control_for_experimental_agc);
  std::unique_ptr<webrtc::VoiceDetectionImpl,_std::default_delete<webrtc::VoiceDetectionImpl>_>::
  ~unique_ptr(&this->voice_detection);
  std::unique_ptr<webrtc::NoiseSuppressionImpl,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
  ::~unique_ptr(&this->noise_suppression);
  std::unique_ptr<webrtc::LevelEstimatorImpl,_std::default_delete<webrtc::LevelEstimatorImpl>_>::
  ~unique_ptr(&this->level_estimator);
  std::unique_ptr<webrtc::HighPassFilterImpl,_std::default_delete<webrtc::HighPassFilterImpl>_>::
  ~unique_ptr(&this->high_pass_filter);
  std::unique_ptr<webrtc::GainControlImpl,_std::default_delete<webrtc::GainControlImpl>_>::
  ~unique_ptr(&this->gain_control);
  std::
  unique_ptr<webrtc::EchoControlMobileImpl,_std::default_delete<webrtc::EchoControlMobileImpl>_>::
  ~unique_ptr(&this->echo_control_mobile);
  std::unique_ptr<webrtc::EchoCancellationImpl,_std::default_delete<webrtc::EchoCancellationImpl>_>
  ::~unique_ptr(&this->echo_cancellation);
  return;
}

Assistant:

ApmPublicSubmodules() {}